

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

bool __thiscall
ON_SubDimple::IsValid(ON_SubDimple *this,ON_SubD *subd,bool bSilentError,ON_TextLog *text_log)

{
  bool bVar1;
  uint uVar2;
  uint local_38;
  uint level_index;
  uint level_count;
  ON_TextLog *text_log_local;
  bool bSilentError_local;
  ON_SubD *subd_local;
  ON_SubDimple *this_local;
  
  bVar1 = ON_SubDHeap::IsValid(&this->m_heap,bSilentError,text_log);
  if (bVar1) {
    uVar2 = ON_SimpleArray<ON_SubDLevel_*>::UnsignedCount(&this->m_levels);
    if (uVar2 == 0) {
      this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
    }
    else {
      for (local_38 = 0; local_38 < uVar2; local_38 = local_38 + 1) {
        bVar1 = IsValidLevel(this,subd,local_38,bSilentError,text_log);
        if (!bVar1) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "Component ids are not set correctly. m_heap.ResetId() will fix this but may break externally stored component references.\n"
                       );
    }
    this_local._7_1_ = ON_SubDIsNotValid(bSilentError);
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SubDimple::IsValid(
  const ON_SubD& subd,
  bool bSilentError,
  ON_TextLog* text_log
  ) const
{
  if (false == m_heap.IsValid(bSilentError, text_log))
  {
    if (nullptr != text_log)
      text_log->Print("Component ids are not set correctly. m_heap.ResetId() will fix this but may break externally stored component references.\n");
    return ON_SubDIsNotValid(bSilentError);
  }

  const unsigned int level_count = m_levels.UnsignedCount();
  if (level_count < 1)
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  for (unsigned int level_index = 0; level_index < level_count; level_index++)
  {
    if (false == IsValidLevel(subd, level_index, bSilentError, text_log))
      return false;
  }  

  return true;
}